

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O0

bool runCompare(CommandLine *cmdLine,ostream *dst)

{
  TestStatusCode TVar1;
  int iVar2;
  bool bVar3;
  deBool dVar4;
  Error *this;
  size_type sVar5;
  LogFileReader *pLVar6;
  reference batchResult;
  char *pcVar7;
  reference pvVar8;
  reference pbVar9;
  reference pvVar10;
  reference pvVar11;
  pointer pTVar12;
  ostream *poVar13;
  char *local_298;
  char *local_268;
  byte local_1b9;
  exception *e;
  __normal_iterator<xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_1a0;
  __normal_iterator<xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_198;
  __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_190;
  const_iterator iter_1;
  int ndx_2;
  __normal_iterator<xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_178;
  __normal_iterator<xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_170;
  __normal_iterator<xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_168;
  __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
  local_160;
  const_iterator iter;
  undefined1 local_150 [7];
  bool allEqual;
  vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> headers;
  string *caseName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  const_iterator caseIter;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  const_iterator nameIter;
  int numEqual;
  int numCases;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  caseList;
  string local_b8;
  int local_94;
  undefined1 local_90 [4];
  int ndx_1;
  int local_7c;
  undefined1 local_78 [4];
  int ndx;
  vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> readers;
  undefined1 local_48 [7];
  bool compareOk;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  batchNames;
  vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> results;
  ostream *dst_local;
  CommandLine *cmdLine_local;
  
  std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::vector
            ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)
             &batchNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  do {
    dVar4 = deGetFalse();
    local_1b9 = 0;
    if (dVar4 == 0) {
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&cmdLine->filenames);
      local_1b9 = bVar3 ^ 0xff;
    }
    if ((local_1b9 & 1) == 0) {
      this = (Error *)__cxa_allocate_exception(0x10);
      xe::Error::Error(this,(char *)0x0,"!cmdLine.filenames.empty()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                       ,0x10e);
      __cxa_throw(this,&xe::Error::typeinfo,xe::Error::~Error);
    }
    dVar4 = deGetFalse();
  } while (dVar4 != 0);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&cmdLine->filenames);
  std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::resize
            ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)
             &batchNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar5);
  std::vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::vector
            ((vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> *
             )local_78);
  for (local_7c = 0; iVar2 = local_7c,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&cmdLine->filenames), iVar2 < (int)sVar5; local_7c = local_7c + 1) {
    pLVar6 = (LogFileReader *)operator_new(0x40);
    batchResult = std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::operator[]
                            ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)
                             &batchNames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_7c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&cmdLine->filenames,(long)local_7c);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    LogFileReader::LogFileReader(pLVar6,batchResult,pcVar7);
    de::SharedPtr<LogFileReader>::SharedPtr((SharedPtr<LogFileReader> *)local_90,pLVar6);
    std::vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::
    push_back((vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
               *)local_78,(value_type *)local_90);
    de::SharedPtr<LogFileReader>::~SharedPtr((SharedPtr<LogFileReader> *)local_90);
    pvVar8 = std::
             vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::
             back((vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                   *)local_78);
    pLVar6 = de::SharedPtr<LogFileReader>::operator->(pvVar8);
    de::Thread::start(&pLVar6->super_Thread);
  }
  for (local_94 = 0; iVar2 = local_94,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&cmdLine->filenames), iVar2 < (int)sVar5; local_94 = local_94 + 1) {
    pvVar8 = std::
             vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::
             operator[]((vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                         *)local_78,(long)local_94);
    pLVar6 = de::SharedPtr<LogFileReader>::operator->(pvVar8);
    de::Thread::join(&pLVar6->super_Thread);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&cmdLine->filenames,(long)local_94);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    de::FilePath::FilePath
              ((FilePath *)
               &caseList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar7);
    de::FilePath::getBaseName_abi_cxx11_
              (&local_b8,
               (FilePath *)
               &caseList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    de::FilePath::~FilePath
              ((FilePath *)
               &caseList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::~vector
            ((vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> *
             )local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&numEqual);
  computeCaseList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&numEqual,
                  (vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)
                  &batchNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&numEqual);
  nameIter._M_current._4_4_ = (int)sVar5;
  nameIter._M_current._0_4_ = 0;
  if (cmdLine->outFormat == OUTPUTFORMAT_CSV) {
    std::operator<<(dst,"TestCasePath");
    local_108._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_100,&local_108);
    while( true ) {
      local_110._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
      bVar3 = __gnu_cxx::operator!=(&local_100,&local_110);
      if (!bVar3) break;
      poVar13 = std::operator<<(dst,",");
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_100);
      std::operator<<(poVar13,(string *)pbVar9);
      caseIter._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator++(&local_100,0);
    }
    std::operator<<(dst,"\n");
  }
  local_128._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&numEqual);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_120,&local_128);
  do {
    caseName = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&numEqual);
    bVar3 = __gnu_cxx::operator!=
                      (&local_120,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&caseName);
    if (!bVar3) {
      bVar3 = (int)nameIter._M_current == nameIter._M_current._4_4_;
      if (cmdLine->outFormat == OUTPUTFORMAT_TEXT) {
        poVar13 = std::operator<<(dst,"  ");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)nameIter._M_current);
        poVar13 = std::operator<<(poVar13," / ");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,nameIter._M_current._4_4_);
        std::operator<<(poVar13," test case results match.\n");
        poVar13 = std::operator<<(dst,"  Comparison ");
        if (bVar3) {
          local_298 = "passed";
        }
        else {
          local_298 = "FAILED";
        }
        poVar13 = std::operator<<(poVar13,local_298);
        std::operator<<(poVar13,"!\n");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&numEqual);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::~vector
                ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)
                 &batchNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return bVar3;
    }
    headers.super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_120);
    std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::vector
              ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
               local_150);
    iter._M_current._7_1_ = 1;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    getTestResultHeaders
              ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
               local_150,
               (vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)
               &batchNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar7);
    local_170._M_current =
         (TestCaseResultHeader *)
         std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::begin
                   ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
                    local_150);
    local_168 = __gnu_cxx::
                __normal_iterator<xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
                ::operator+(&local_170,1);
    __gnu_cxx::
    __normal_iterator<xe::TestCaseResultHeader_const*,std::vector<xe::TestCaseResultHeader,std::allocator<xe::TestCaseResultHeader>>>
    ::__normal_iterator<xe::TestCaseResultHeader*>
              ((__normal_iterator<xe::TestCaseResultHeader_const*,std::vector<xe::TestCaseResultHeader,std::allocator<xe::TestCaseResultHeader>>>
                *)&local_160,&local_168);
    while( true ) {
      local_178._M_current =
           (TestCaseResultHeader *)
           std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::end
                     ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *
                      )local_150);
      bVar3 = __gnu_cxx::operator!=(&local_160,&local_178);
      if (!bVar3) break;
      pTVar12 = __gnu_cxx::
                __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
                ::operator->(&local_160);
      TVar1 = pTVar12->statusCode;
      pvVar11 = std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::
                operator[]((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                            *)local_150,0);
      if (TVar1 != pvVar11->statusCode) {
        iter._M_current._7_1_ = 0;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
      ::operator++(&local_160,0);
    }
    if ((iter._M_current._7_1_ & 1) != 0) {
      nameIter._M_current._0_4_ = (int)nameIter._M_current + 1;
    }
    if ((cmdLine->outMode == OUTPUTMODE_ALL) || ((iter._M_current._7_1_ & 1) == 0)) {
      if (cmdLine->outFormat == OUTPUTFORMAT_TEXT) {
        poVar13 = std::operator<<(dst,(string *)
                                      headers.
                                      super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator<<(poVar13,"\n");
        for (iter_1._M_current._4_4_ = 0; iVar2 = iter_1._M_current._4_4_,
            sVar5 = std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                    ::size((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                            *)local_150), iVar2 < (int)sVar5;
            iter_1._M_current._4_4_ = iter_1._M_current._4_4_ + 1) {
          poVar13 = std::operator<<(dst,"  ");
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_48,(long)iter_1._M_current._4_4_);
          poVar13 = std::operator<<(poVar13,(string *)pvVar10);
          poVar13 = std::operator<<(poVar13,": ");
          pvVar11 = std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                    ::operator[]((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                                  *)local_150,(long)iter_1._M_current._4_4_);
          pcVar7 = getStatusCodeName(pvVar11->statusCode);
          poVar13 = std::operator<<(poVar13,pcVar7);
          poVar13 = std::operator<<(poVar13," (");
          pvVar11 = std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                    ::operator[]((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                                  *)local_150,(long)iter_1._M_current._4_4_);
          poVar13 = std::operator<<(poVar13,(string *)&pvVar11->statusDetails);
          std::operator<<(poVar13,")\n");
        }
        std::operator<<(dst,"\n");
      }
      else if (cmdLine->outFormat == OUTPUTFORMAT_CSV) {
        std::operator<<(dst,(string *)
                            headers.
                            super__Vector_base<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_198._M_current =
             (TestCaseResultHeader *)
             std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::begin
                       ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                         *)local_150);
        __gnu_cxx::
        __normal_iterator<xe::TestCaseResultHeader_const*,std::vector<xe::TestCaseResultHeader,std::allocator<xe::TestCaseResultHeader>>>
        ::__normal_iterator<xe::TestCaseResultHeader*>
                  ((__normal_iterator<xe::TestCaseResultHeader_const*,std::vector<xe::TestCaseResultHeader,std::allocator<xe::TestCaseResultHeader>>>
                    *)&local_190,&local_198);
        while( true ) {
          local_1a0._M_current =
               (TestCaseResultHeader *)
               std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::end
                         ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>
                           *)local_150);
          bVar3 = __gnu_cxx::operator!=(&local_190,&local_1a0);
          if (!bVar3) break;
          poVar13 = std::operator<<(dst,",");
          if (cmdLine->outValue == OUTPUTVALUE_STATUS_CODE) {
            pTVar12 = __gnu_cxx::
                      __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
                      ::operator->(&local_190);
            local_268 = getStatusCodeName(pTVar12->statusCode);
          }
          else {
            __gnu_cxx::
            __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
            ::operator->(&local_190);
            local_268 = (char *)std::__cxx11::string::c_str();
          }
          std::operator<<(poVar13,local_268);
          __gnu_cxx::
          __normal_iterator<const_xe::TestCaseResultHeader_*,_std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>_>
          ::operator++(&local_190,0);
        }
        std::operator<<(dst,"\n");
      }
    }
    std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::~vector
              ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
               local_150);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_120,0);
  } while( true );
}

Assistant:

static bool runCompare (const CommandLine& cmdLine, std::ostream& dst)
{
	vector<ShortBatchResult>	results;
	vector<string>				batchNames;
	bool						compareOk	= true;

	XE_CHECK(!cmdLine.filenames.empty());

	try
	{
		// Read in batch results
		results.resize(cmdLine.filenames.size());
		{
			std::vector<de::SharedPtr<LogFileReader> > readers;

			for (int ndx = 0; ndx < (int)cmdLine.filenames.size(); ndx++)
			{
				readers.push_back(de::SharedPtr<LogFileReader>(new LogFileReader(results[ndx], cmdLine.filenames[ndx].c_str())));
				readers.back()->start();
			}

			for (int ndx = 0; ndx < (int)cmdLine.filenames.size(); ndx++)
			{
				readers[ndx]->join();

				// Use file name as batch name.
				batchNames.push_back(de::FilePath(cmdLine.filenames[ndx].c_str()).getBaseName());
			}
		}

		// Compute unified case list.
		vector<string> caseList;
		computeCaseList(caseList, results);

		// Stats.
		int		numCases		= (int)caseList.size();
		int		numEqual		= 0;

		if (cmdLine.outFormat == OUTPUTFORMAT_CSV)
		{
			dst << "TestCasePath";
			for (vector<string>::const_iterator nameIter = batchNames.begin(); nameIter != batchNames.end(); nameIter++)
				dst << "," << *nameIter;
			dst << "\n";
		}

		// Compare cases.
		for (vector<string>::const_iterator caseIter = caseList.begin(); caseIter != caseList.end(); caseIter++)
		{
			const string&						caseName	= *caseIter;
			vector<xe::TestCaseResultHeader>	headers;
			bool								allEqual	= true;

			getTestResultHeaders(headers, results, caseName.c_str());

			for (vector<xe::TestCaseResultHeader>::const_iterator iter = headers.begin()+1; iter != headers.end(); iter++)
			{
				if (iter->statusCode != headers[0].statusCode)
				{
					allEqual = false;
					break;
				}
			}

			if (allEqual)
				numEqual += 1;

			if (cmdLine.outMode == OUTPUTMODE_ALL || !allEqual)
			{
				if (cmdLine.outFormat == OUTPUTFORMAT_TEXT)
				{
					dst << caseName << "\n";
					for (int ndx = 0; ndx < (int)headers.size(); ndx++)
						dst << "  " << batchNames[ndx] << ": " << getStatusCodeName(headers[ndx].statusCode) << " (" << headers[ndx].statusDetails << ")\n";
					dst << "\n";
				}
				else if (cmdLine.outFormat == OUTPUTFORMAT_CSV)
				{
					dst << caseName;
					for (vector<xe::TestCaseResultHeader>::const_iterator iter = headers.begin(); iter != headers.end(); iter++)
						dst << "," << (cmdLine.outValue == OUTPUTVALUE_STATUS_CODE ? getStatusCodeName(iter->statusCode) : iter->statusDetails.c_str());
					dst << "\n";
				}
			}
		}

		compareOk = numEqual == numCases;

		if (cmdLine.outFormat == OUTPUTFORMAT_TEXT)
		{
			dst << "  " << numEqual << " / " << numCases << " test case results match.\n";
			dst << "  Comparison " << (compareOk ? "passed" : "FAILED") << "!\n";
		}
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		compareOk = false;
	}

	return compareOk;
}